

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferViewVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::BufferViewVkImpl::~BufferViewVkImpl(BufferViewVkImpl *this)

{
  RenderDeviceVkImpl *this_00;
  int iVar1;
  undefined4 extraout_var;
  BufferViewVkImpl *this_local;
  
  this_00 = (this->super_BufferViewBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
            .m_pDevice;
  iVar1 = (*(((this->super_BufferViewBase<Diligent::EngineVkImplTraits>).m_pBuffer)->
            super_IDeviceObject).super_IObject._vptr_IObject[4])();
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
  ::
  SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkBufferView_T*,(VulkanUtilities::VulkanHandleTypeId)3>,void>
            ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
              *)this_00,&this->m_BuffView,*(Uint64 *)(CONCAT44(extraout_var,iVar1) + 0x20));
  VulkanUtilities::VulkanObjectWrapper<VkBufferView_T_*,_(VulkanUtilities::VulkanHandleTypeId)3>::
  ~VulkanObjectWrapper(&this->m_BuffView);
  BufferViewBase<Diligent::EngineVkImplTraits>::~BufferViewBase
            (&this->super_BufferViewBase<Diligent::EngineVkImplTraits>);
  return;
}

Assistant:

BufferViewVkImpl::~BufferViewVkImpl()
{
    m_pDevice->SafeReleaseDeviceObject(std::move(m_BuffView), m_pBuffer->GetDesc().ImmediateContextMask);
}